

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O2

void PDHG_Compute_Step_Size_Ratio(CUPDLPwork *pdhg)

{
  CUPDLPproblem *pCVar1;
  CUPDLPstepsize *pCVar2;
  CUPDLPiterates *pCVar3;
  CUPDLPvec *pCVar4;
  cupdlp_float cVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  cupdlp_float cVar10;
  cupdlp_float dDiffDual;
  cupdlp_float dDiffPrimal;
  
  pCVar1 = pdhg->problem;
  pCVar2 = pdhg->stepsize;
  dVar7 = pCVar2->dPrimalStep * pCVar2->dDualStep;
  pCVar3 = pdhg->iterates;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  iVar6 = pdhg->timers->nIter % 2;
  pCVar4 = pCVar3->y[iVar6];
  dDiffPrimal = 0.0;
  cupdlp_diffTwoNorm(pdhg,pCVar3->x[iVar6]->data,pCVar3->xLastRestart,pCVar1->nCols,&dDiffPrimal);
  dDiffDual = 0.0;
  cupdlp_diffTwoNorm(pdhg,pCVar4->data,pCVar3->yLastRestart,pCVar1->nRows,&dDiffDual);
  cVar5 = dDiffPrimal;
  cVar10 = dDiffDual;
  dVar8 = fmin(dDiffPrimal,dDiffDual);
  if (dVar8 <= 1e-10) {
    cVar10 = pCVar2->dBeta;
  }
  else {
    dVar9 = log(cVar10 / cVar5);
    dVar8 = pCVar2->dBeta;
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    dVar8 = log(dVar8);
    dVar8 = dVar8 * 0.5 + dVar9 * 0.5;
    dVar9 = exp(dVar8);
    dVar8 = exp(dVar8);
    cVar10 = dVar8 * dVar9;
    pCVar2->dBeta = cVar10;
  }
  if (cVar10 < 0.0) {
    dVar8 = sqrt(cVar10);
  }
  else {
    dVar8 = SQRT(cVar10);
  }
  pCVar2->dPrimalStep = dVar7 / dVar8;
  pCVar2->dDualStep = (dVar7 / dVar8) * pCVar2->dBeta;
  pCVar2->dTheta = 1.0;
  return;
}

Assistant:

void PDHG_Compute_Step_Size_Ratio(CUPDLPwork *pdhg) {
  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPiterates *iterates = pdhg->iterates;
  CUPDLPstepsize *stepsize = pdhg->stepsize;
  cupdlp_float dMeanStepSize =
      sqrt(stepsize->dPrimalStep * stepsize->dDualStep);

  cupdlp_int iter = pdhg->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];

  // cupdlp_float dDiffPrimal = cupdlp_diffTwoNorm(x, iterates->xLastRestart, problem->nCols);
  // cupdlp_float dDiffDual = cupdlp_diffTwoNorm(y, iterates->yLastRestart, problem->nRows);

  cupdlp_float dDiffPrimal = 0.0;
  cupdlp_diffTwoNorm(pdhg, x->data, iterates->xLastRestart, problem->nCols, &dDiffPrimal);
  cupdlp_float dDiffDual = 0.0;
  cupdlp_diffTwoNorm(pdhg, y->data, iterates->yLastRestart, problem->nRows, &dDiffDual);

  if (fmin(dDiffPrimal, dDiffDual) > 1e-10) {
    cupdlp_float dBetaUpdate = dDiffDual / dDiffPrimal;
    cupdlp_float dLogBetaUpdate =
        0.5 * log(dBetaUpdate) + 0.5 * log(sqrt(stepsize->dBeta));
    stepsize->dBeta = exp(dLogBetaUpdate) * exp(dLogBetaUpdate);
  }

  stepsize->dPrimalStep = dMeanStepSize / sqrt(stepsize->dBeta);
  stepsize->dDualStep = stepsize->dPrimalStep * stepsize->dBeta;
  stepsize->dTheta = 1.0;
}